

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  bool bVar1;
  uint uVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  string *psVar5;
  string *value;
  EnumDescriptor *pEVar6;
  OneofDescriptor *pOVar7;
  FieldOptions *this_00;
  FieldOptions *pFVar8;
  int __c;
  FieldDescriptorProto *in_RSI;
  FieldDescriptor *in_RDI;
  FieldDescriptorProto *unaff_retaddr;
  bool in_stack_00000197;
  FieldDescriptor *in_stack_00000198;
  string *in_stack_ffffffffffffff48;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto *in_stack_ffffffffffffff50;
  FieldDescriptor *in_stack_ffffffffffffff60;
  FieldDescriptorProto *in_stack_ffffffffffffff70;
  string local_38;
  Type local_18;
  Label local_14;
  FieldDescriptorProto *local_10;
  FieldDescriptor *value_01;
  
  local_10 = in_RSI;
  value_01 = in_RDI;
  name_abi_cxx11_(in_RDI);
  FieldDescriptorProto::set_name(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  number(in_RDI);
  FieldDescriptorProto::set_number
            (in_stack_ffffffffffffff50,(int32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (((byte)in_RDI[0x41] & 1) != 0) {
    json_name_abi_cxx11_(in_RDI);
    FieldDescriptorProto::set_json_name(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  value_00 = (FieldDescriptorProto_Label)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_14 = label(in_RDI);
  internal::implicit_cast<int,google::protobuf::FieldDescriptor::Label>(&local_14);
  FieldDescriptorProto::set_label(in_stack_ffffffffffffff50,value_00);
  local_18 = type(in_stack_ffffffffffffff60);
  uVar2 = internal::implicit_cast<int,google::protobuf::FieldDescriptor::Type>(&local_18);
  value = (string *)(ulong)uVar2;
  FieldDescriptorProto::set_type(in_stack_ffffffffffffff50,value_00);
  bVar1 = is_extension(in_RDI);
  if (bVar1) {
    pDVar4 = containing_type(in_RDI);
    if (((byte)pDVar4[0x89] & 1) == 0) {
      FieldDescriptorProto::set_extendee(unaff_retaddr,(char *)value_01);
    }
    psVar5 = FieldDescriptorProto::mutable_extendee_abi_cxx11_((FieldDescriptorProto *)0x4ada27);
    pDVar4 = containing_type(in_RDI);
    value = Descriptor::full_name_abi_cxx11_(pDVar4);
    std::__cxx11::string::append((string *)psVar5);
  }
  CVar3 = cpp_type((FieldDescriptor *)0x4ada55);
  if (CVar3 == CPPTYPE_MESSAGE) {
    pDVar4 = message_type((FieldDescriptor *)in_stack_ffffffffffffff50);
    if (((byte)pDVar4[0x88] & 1) != 0) {
      FieldDescriptorProto::clear_type(local_10);
    }
    pDVar4 = message_type((FieldDescriptor *)in_stack_ffffffffffffff50);
    if (((byte)pDVar4[0x89] & 1) == 0) {
      FieldDescriptorProto::set_type_name(unaff_retaddr,(char *)value_01);
    }
    psVar5 = FieldDescriptorProto::mutable_type_name_abi_cxx11_((FieldDescriptorProto *)0x4adaae);
    pDVar4 = message_type((FieldDescriptor *)in_stack_ffffffffffffff50);
    value = Descriptor::full_name_abi_cxx11_(pDVar4);
    std::__cxx11::string::append((string *)psVar5);
  }
  else {
    CVar3 = cpp_type((FieldDescriptor *)0x4adade);
    if (CVar3 == CPPTYPE_ENUM) {
      pEVar6 = enum_type((FieldDescriptor *)in_stack_ffffffffffffff50);
      if (((byte)pEVar6[0x29] & 1) == 0) {
        FieldDescriptorProto::set_type_name(unaff_retaddr,(char *)value_01);
      }
      in_stack_ffffffffffffff70 =
           (FieldDescriptorProto *)
           FieldDescriptorProto::mutable_type_name_abi_cxx11_((FieldDescriptorProto *)0x4adb14);
      pEVar6 = enum_type((FieldDescriptor *)in_stack_ffffffffffffff50);
      value = EnumDescriptor::full_name_abi_cxx11_(pEVar6);
      std::__cxx11::string::append((string *)in_stack_ffffffffffffff70);
    }
  }
  bVar1 = has_default_value(in_RDI);
  if (bVar1) {
    value = &local_38;
    DefaultValueAsString_abi_cxx11_(in_stack_00000198,in_stack_00000197);
    FieldDescriptorProto::set_default_value(in_stack_ffffffffffffff70,value);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pOVar7 = containing_oneof(in_RDI);
  if ((pOVar7 != (OneofDescriptor *)0x0) && (bVar1 = is_extension(in_RDI), !bVar1)) {
    pOVar7 = containing_oneof(in_RDI);
    OneofDescriptor::index(pOVar7,(char *)value,__c);
    FieldDescriptorProto::set_oneof_index(in_stack_ffffffffffffff50,value_00);
  }
  this_00 = options(in_RDI);
  pFVar8 = FieldOptions::default_instance();
  if (this_00 != pFVar8) {
    pFVar8 = FieldDescriptorProto::mutable_options((FieldDescriptorProto *)0x4adc27);
    options(in_RDI);
    FieldOptions::CopyFrom(this_00,pFVar8);
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
      implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
      implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}